

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_parser.cpp
# Opt level: O0

size_t __thiscall
HawkTracer::ClientUtils::CommandLineParser::_get_max_option_length
          (CommandLineParser *this,size_t value_help_length)

{
  bool bVar1;
  reference pvVar2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>_>_>
  *local_48;
  size_t length;
  value_type *option;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>_>_>
  *__range2;
  size_t max_option_length;
  size_t value_help_length_local;
  CommandLineParser *this_local;
  
  __range2 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>_>_>
              *)0x0;
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>_>_>
           ::begin(&this->_registered_options);
  option = (value_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>_>_>
           ::end(&this->_registered_options);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>,_true>
                         *)&option);
    if (!bVar1) break;
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>,_false,_true>
             ::operator*(&__end2);
    local_48 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>_>_>
                *)std::__cxx11::string::length();
    if (((pvVar2->second).is_flag & 1U) == 0) {
      local_48 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>_>_>
                  *)((long)&(local_48->_M_h)._M_buckets + value_help_length);
    }
    if (__range2 < local_48) {
      __range2 = local_48;
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>,_false,_true>
    ::operator++(&__end2);
  }
  return (size_t)__range2;
}

Assistant:

size_t CommandLineParser::_get_max_option_length(size_t value_help_length) const
{
    size_t max_option_length = 0;
    for (const auto& option : _registered_options)
    {
        size_t length = option.first.length();
        if (!option.second.is_flag)
        {
            length += value_help_length;
        }
        if (length > max_option_length)
        {
            max_option_length = length;
        }
    }

    return max_option_length;
}